

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void event_go_to_time_for_bed(tgestate_t *state)

{
  tgestate_t *in_RDI;
  
  in_RDI->bell = '(';
  in_RDI->locked_doors[0] = 0x80;
  in_RDI->locked_doors[1] = 0x81;
  queue_message(in_RDI,message_TIME_FOR_BED);
  go_to_time_for_bed((tgestate_t *)0x115e1d);
  return;
}

Assistant:

static void event_go_to_time_for_bed(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;

  /* Lock the gates. */
  state->locked_doors[0] = 0 | door_LOCKED; /* Index into doors + set locked flag. */
  state->locked_doors[1] = 1 | door_LOCKED;

  queue_message(state, message_TIME_FOR_BED);
  go_to_time_for_bed(state);
}